

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.h
# Opt level: O0

string * __thiscall
Application::genOrderID_abi_cxx11_(string *__return_storage_ptr__,Application *this)

{
  int __val;
  Application *this_local;
  
  __val = *(int *)&this[10]._vptr_Application + 1;
  *(int *)&this[10]._vptr_Application = __val;
  std::__cxx11::to_string(__return_storage_ptr__,__val);
  return __return_storage_ptr__;
}

Assistant:

std::string genOrderID() { return std::to_string(++m_orderID); }